

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

Symbol * __thiscall
ByteCodeGenerator::AddSymbolToScope
          (ByteCodeGenerator *this,Scope *scope,char16 *key,int keyLength,ParseNode *varDecl,
          SymbolType symbolType)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeVar *pPVar3;
  ParseNodeName *pPVar4;
  undefined4 *puVar5;
  Scope *pSVar6;
  Symbol *sym;
  
  if (varDecl->nop - 0x51 < 3) {
    pPVar3 = ParseNode::AsParseNodeVar(varDecl);
    sym = pPVar3->sym;
  }
  else if (varDecl->nop == knopName) {
    pPVar4 = ParseNode::AsParseNodeName(varDecl);
    if (pPVar4->symRef == (Symbol **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x704,"(varDecl->AsParseNodeName()->GetSymRef())",
                         "varDecl->AsParseNodeName()->GetSymRef()");
      if (!bVar2) goto LAB_0077b67c;
      *puVar5 = 0;
    }
    pPVar4 = ParseNode::AsParseNodeName(varDecl);
    sym = *pPVar4->symRef;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x708,"(0)","0");
    if (!bVar2) goto LAB_0077b67c;
    *puVar5 = 0;
    sym = (Symbol *)0x0;
  }
  pSVar6 = sym->scope;
  if (pSVar6 == scope) {
LAB_0077b601:
    if (pSVar6 != (Scope *)0x0) goto LAB_0077b606;
  }
  else {
    if (pSVar6->scopeType != ScopeType_Parameter) {
      if (1 < scope->scopeType - ScopeType_Global) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x714,
                           "(scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                           ,
                           "scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock"
                          );
        if (!bVar2) goto LAB_0077b67c;
        *puVar5 = 0;
      }
      Scope::AddNewSymbol(scope,sym);
      pSVar6 = sym->scope;
      goto LAB_0077b601;
    }
LAB_0077b606:
    if ((pSVar6 == scope) || (pSVar6->scopeType == ScopeType_Parameter)) goto LAB_0077b65f;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                     ,0x718,
                     "(sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter))"
                     ,
                     "sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter)"
                    );
  if (!bVar2) {
LAB_0077b67c:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
LAB_0077b65f:
  if ((sym->field_0x44 & 0x40) != 0) {
    Scope::SetIsObject(scope);
  }
  return sym;
}

Assistant:

Symbol * ByteCodeGenerator::AddSymbolToScope(Scope *scope, const char16 *key, int keyLength, ParseNode *varDecl, SymbolType symbolType)
{
    Symbol *sym = nullptr;

    switch (varDecl->nop)
    {
    case knopConstDecl:
    case knopLetDecl:
    case knopVarDecl:
        sym = varDecl->AsParseNodeVar()->sym;
        break;
    case knopName:
        AnalysisAssert(varDecl->AsParseNodeName()->GetSymRef());
        sym = *varDecl->AsParseNodeName()->GetSymRef();
        break;
    default:
        AnalysisAssert(0);
        sym = nullptr;
        break;
    }

    if (sym->GetScope() != scope && sym->GetScope()->GetScopeType() != ScopeType_Parameter)
    {
        // This can happen when we have a function declared at global eval scope, and it has
        // references in deferred function bodies inside the eval. The BCG creates a new global scope
        // on such compiles, so we essentially have to migrate the symbol to the new scope.
        // We check fscrEvalCode, not fscrEval, because the same thing can happen in indirect eval,
        // when fscrEval is not set.
        Assert(scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock);
        scope->AddNewSymbol(sym);
    }

    Assert(sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter));

    if (sym->NeedsScopeObject())
    {
        scope->SetIsObject();
    }

    return sym;
}